

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall
Console::Prompt::Private::concharArrayToString(Private *this,conchar *data,usize len,String *result)

{
  conchar *end;
  conchar *i;
  String *result_local;
  usize len_local;
  conchar *data_local;
  Private *this_local;
  
  String::clear(result);
  if ((this->utf8 & 1U) == 0) {
    String::reserve(result,len);
    for (end = data; end < data + len; end = end + 1) {
      String::append(result,(char)*end);
    }
  }
  else {
    String::reserve(result,len << 2);
    Unicode::append(data,len,result);
  }
  return;
}

Assistant:

void concharArrayToString(const conchar* data, usize len, String& result)
  {
    result.clear();
#ifdef _MSC_VER
    result.append(data, len);
#else
    if(utf8)
    {
      result.reserve(len * sizeof(uint32));
      Unicode::append(data, len, result);
    }
    else
    {
      result.reserve(len);
      for(const conchar* i = data, * end = data + len; i < end; ++i)
        result.append((const char&)*i);
    }
#endif
  }